

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void row_mt_mem_alloc(AV1_COMP *cpi,int max_rows,int max_cols,int alloc_row_ctx)

{
  int iVar1;
  int iVar2;
  long lVar3;
  void *pvVar4;
  int in_ECX;
  int in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  int sb_rows;
  int num_row_ctx;
  TileDataEnc *this_tile;
  int tile_index;
  int tile_row;
  int tile_col;
  int tile_rows;
  int tile_cols;
  AV1EncRowMultiThreadInfo *enc_row_mt;
  AV1Common *cm;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar5;
  int iVar6;
  int iVar7;
  
  iVar2 = *(int *)(in_RDI + 0x42020);
  iVar7 = *(int *)(in_RDI + 0x42024);
  av1_row_mt_mem_dealloc((AV1_COMP *)CONCAT44(iVar2,iVar7));
  for (iVar5 = 0; iVar5 < iVar7; iVar5 = iVar5 + 1) {
    for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
      iVar1 = iVar5 * iVar2 + iVar6;
      lVar3 = *(long *)(in_RDI + 0x71318) + (long)iVar1 * 0x5d10;
      row_mt_sync_mem_alloc
                ((AV1EncRowMultiThreadSync *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
      if (in_ECX != 0) {
        if (in_EDX + -1 < 1) {
          in_stack_ffffffffffffffac = 1;
        }
        else {
          in_stack_ffffffffffffffac = in_EDX + -1;
        }
        in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffac;
        pvVar4 = aom_memalign(CONCAT44(iVar6,iVar5),CONCAT44(iVar1,in_stack_ffffffffffffffc0));
        *(void **)(lVar3 + 0x5320) = pvVar4;
        if (*(long *)(lVar3 + 0x5320) == 0) {
          aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3bfb0),AOM_CODEC_MEM_ERROR,
                             "Failed to allocate this_tile->row_ctx");
        }
      }
    }
  }
  iVar2 = get_sb_rows_in_frame((AV1_COMMON *)(in_RDI + 0x3bf80));
  pvVar4 = aom_malloc(0x251eb5);
  *(void **)(in_RDI + 0x9afa8) = pvVar4;
  if (*(long *)(in_RDI + 0x9afa8) == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3bfb0),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate enc_row_mt->num_tile_cols_done");
  }
  *(undefined4 *)(in_RDI + 0x9aea0) = in_ESI;
  *(int *)(in_RDI + 0x9aea4) = in_EDX + -1;
  *(int *)(in_RDI + 0x9afb0) = iVar2;
  return;
}

Assistant:

static void row_mt_mem_alloc(AV1_COMP *cpi, int max_rows, int max_cols,
                             int alloc_row_ctx) {
  struct AV1Common *cm = &cpi->common;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &cpi->mt_info.enc_row_mt;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  int tile_col, tile_row;

  av1_row_mt_mem_dealloc(cpi);

  // Allocate memory for row based multi-threading
  for (tile_row = 0; tile_row < tile_rows; tile_row++) {
    for (tile_col = 0; tile_col < tile_cols; tile_col++) {
      int tile_index = tile_row * tile_cols + tile_col;
      TileDataEnc *const this_tile = &cpi->tile_data[tile_index];

      row_mt_sync_mem_alloc(&this_tile->row_mt_sync, cm, max_rows);

      if (alloc_row_ctx) {
        assert(max_cols > 0);
        const int num_row_ctx = AOMMAX(1, (max_cols - 1));
        CHECK_MEM_ERROR(cm, this_tile->row_ctx,
                        (FRAME_CONTEXT *)aom_memalign(
                            16, num_row_ctx * sizeof(*this_tile->row_ctx)));
      }
    }
  }
  const int sb_rows = get_sb_rows_in_frame(cm);
  CHECK_MEM_ERROR(
      cm, enc_row_mt->num_tile_cols_done,
      aom_malloc(sizeof(*enc_row_mt->num_tile_cols_done) * sb_rows));

  enc_row_mt->allocated_rows = max_rows;
  enc_row_mt->allocated_cols = max_cols - 1;
  enc_row_mt->allocated_sb_rows = sb_rows;
}